

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O3

VRDatumPtr __thiscall MinVR::CreateVRDatumFloatArray(MinVR *this,void *pData)

{
  VRDatumFloatArray *this_00;
  undefined4 *puVar1;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar2;
  vector<float,_std::allocator<float>_> local_30;
  
  this_00 = (VRDatumFloatArray *)operator_new(0x68);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_30,(vector<float,_std::allocator<float>_> *)pData);
  VRDatumFloatArray::VRDatumFloatArray(this_00,&local_30);
  if (local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  *(VRDatumFloatArray **)this = this_00;
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 1;
  *(undefined4 **)(this + 8) = puVar1;
  VVar2.reference = extraout_RDX;
  VVar2.pData = (VRDatum_conflict *)this;
  return VVar2;
}

Assistant:

VRDatumPtr CreateVRDatumFloatArray(void *pData) {
  VRDatumFloatArray *obj =
    new VRDatumFloatArray(*static_cast<VRFloatArray *>(pData));
  return VRDatumPtr(obj);
}